

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O2

Variable __thiscall runtime::VirtualMachine::popOpStack(VirtualMachine *this)

{
  pointer *ppVVar1;
  VariableType VVar2;
  element_type *peVar3;
  pointer pVVar4;
  pointer pVVar5;
  anon_union_8_6_52c89740_for_Variable_1 aVar6;
  reference pvVar7;
  Variable VVar8;
  string local_40;
  allocator<char> local_19;
  
  peVar3 = (this->stackFrame).super___shared_ptr<runtime::StackFrame,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar3 == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"No active stack frame found to pop op stack from!",&local_19);
    panic(this,&local_40);
  }
  pVVar4 = (peVar3->opStack).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar5 = (peVar3->opStack).
           super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar5) {
    pvVar7 = std::vector<runtime::Variable,_std::allocator<runtime::Variable>_>::at
                       (&peVar3->opStack,((long)pVVar5 - (long)pVVar4 >> 4) - 1);
    VVar2 = pvVar7->type;
    aVar6 = (anon_union_8_6_52c89740_for_Variable_1)(pvVar7->field_1).integerValue;
    ppVVar1 = &(peVar3->opStack).
               super__Vector_base<runtime::Variable,_std::allocator<runtime::Variable>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + -1;
    VVar8._4_4_ = 0;
    VVar8.type = VVar2;
    VVar8.field_1 =
         (anon_union_8_6_52c89740_for_Variable_1)
         (anon_union_8_6_52c89740_for_Variable_1)aVar6.integerValue;
    return VVar8;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Could not pop op stack, it is empty!",&local_19);
  panic(this,&local_40);
}

Assistant:

Variable runtime::VirtualMachine::popOpStack() {
  if (this->stackFrame == nullptr) {
    this->panic("No active stack frame found to pop op stack from!");
  }

  auto opStack = &this->stackFrame->opStack;

  if (opStack->empty()) {
    this->panic("Could not pop op stack, it is empty!");

  } else {
    Variable topOfStack = opStack->at(opStack->size() - 1);
    opStack->pop_back();

    return topOfStack;
  }
}